

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_detection.cpp
# Opt level: O3

void duckdb::CSVSniffer::SetDateFormat
               (CSVStateMachine *candidate,string *format_specifier,LogicalTypeId *sql_type)

{
  pointer pSVar1;
  mapped_type *this;
  size_t __n;
  StrpTimeFormat strpformat;
  undefined1 local_130 [8];
  _Alloc_hider local_128;
  char local_118 [16];
  _Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_> local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f0 [24];
  idx_t local_d8;
  vector<int,_std::allocator<int>_> local_d0;
  StrTimeFormat local_b8;
  string local_40;
  
  StrpTimeFormat::StrpTimeFormat((StrpTimeFormat *)&local_b8);
  StrTimeFormat::ParseFormatSpecifier(&local_40,format_specifier,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  this = ::std::
         map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
         ::operator[](&(candidate->dialect_options).date_format,sql_type);
  local_130 = (undefined1  [8])&PTR__StrTimeFormat_01988150;
  local_128._M_p = local_118;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_128,local_b8.format_specifier._M_dataplus._M_p,
             local_b8.format_specifier._M_dataplus._M_p + local_b8.format_specifier._M_string_length
            );
  local_108._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::_Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>::
  _M_create_storage(&local_108,
                    (long)local_b8.specifiers.
                          super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>
                          .
                          super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_b8.specifiers.
                          super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>
                          .
                          super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  pSVar1 = local_108._M_impl.super__Vector_impl_data._M_start;
  __n = (long)local_b8.specifiers.
              super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
              super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_b8.specifiers.
              super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
              super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>
              ._M_impl.super__Vector_impl_data._M_start;
  if (__n != 0) {
    memmove(local_108._M_impl.super__Vector_impl_data._M_start,
            local_b8.specifiers.
            super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
            super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
            _M_impl.super__Vector_impl_data._M_start,__n);
  }
  local_108._M_impl.super__Vector_impl_data._M_finish = pSVar1 + __n;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(local_f0,&local_b8.literals.
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          );
  local_d8 = local_b8.constant_size;
  ::std::vector<int,_std::allocator<int>_>::vector
            (&local_d0,&local_b8.numeric_width.super_vector<int,_std::allocator<int>_>);
  local_130 = (undefined1  [8])&PTR__StrTimeFormat_019881c8;
  CSVOption<duckdb::StrpTimeFormat>::Set(this,(StrpTimeFormat *)local_130,false);
  StrTimeFormat::~StrTimeFormat((StrTimeFormat *)local_130);
  StrTimeFormat::~StrTimeFormat(&local_b8);
  return;
}

Assistant:

void CSVSniffer::SetDateFormat(CSVStateMachine &candidate, const string &format_specifier,
                               const LogicalTypeId &sql_type) {
	StrpTimeFormat strpformat;
	StrTimeFormat::ParseFormatSpecifier(format_specifier, strpformat);
	candidate.dialect_options.date_format[sql_type].Set(strpformat, false);
}